

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O2

Bytes * __thiscall
SSM::ECUPort::readECUPacket(Bytes *__return_storage_ptr__,ECUPort *this,bool echo)

{
  Byte csum;
  Bytes header;
  byte *local_68 [7];
  
  std::vector<std::byte,_std::allocator<std::byte>_>::vector(&header,4,(allocator_type *)local_68);
  do {
    readBytes((Bytes *)local_68,this,1);
    *header.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
     super__Vector_impl_data._M_start = *local_68[0];
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)local_68);
  } while( true );
}

Assistant:

Bytes ECUPort::readECUPacket(bool echo) const
  {
    // Skip until we receive next complete package
    // Expected header of packet: -header byte,
    //                            -destination byte
    //                            -source byte
    //                            -datasize byte
    Bytes header(4);
    Byte SRC(ECU),DEST(TOOL);
    if(echo) std::swap(SRC, DEST);
    while(true)
      {
	header[0] = readBytes(1)[0];
	if (header[0] != HEADER) continue;

	header[1] = readBytes(1)[0];
	if (header[1] != DEST) continue;

	header[2] = readBytes(1)[0];
	if (header[2] != SRC) continue;

	header[3] = readBytes(1)[0];
	break;
      }

    // Now that dsize is known read response body and checksum
    uint8_t dsize = std::to_integer<uint8_t>(header.back());
    Bytes body = readBytes(dsize); Byte csum = readBytes(1)[0];

    // Validate checksum
    body.insert(body.begin(), header.begin(), header.end());
    if(csum != checksum(body))
      throw(InvalidChecksum("Checksum validation failed"));

    // Add the checksum and return
    body.push_back(csum);
    return body;
  }